

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::FlushFinishTests::init(FlushFinishTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"wait","Wait only");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x3dcccccd00000000;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0xc47a000000000001;
  pTVar2[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__FlushFinishCase_00d37358;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"flush","Flush only");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x3e4ccccd00000000;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x3f00000000000001;
  pTVar2[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__FlushFinishCase_00d37448;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"flush_wait","Wait after flushing");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x3e4ccccd00000000;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x3dcccccd00000000;
  pTVar2[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__FlushFinishCase_00d374a0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"finish","Finish only");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x3f00000000000001;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x3dcccccd00000000;
  pTVar2[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__FlushFinishCase_00d374f8;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"finish_wait","Finish and wait");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x3f00000000000001;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x3dcccccd00000000;
  pTVar2[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__FlushFinishCase_00d37550;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void FlushFinishTests::init (void)
{
	addChild(new WaitOnlyCase	(m_context));
	addChild(new FlushOnlyCase	(m_context));
	addChild(new FlushWaitCase	(m_context));
	addChild(new FinishOnlyCase	(m_context));
	addChild(new FinishWaitCase	(m_context));
}